

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpagesetupdialog_unix_p.cpp
# Opt level: O2

void QPageSetupWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      pageSizeChanged((QPageSetupWidget *)_o);
      return;
    case 1:
      pageOrientationChanged((QPageSetupWidget *)_o);
      return;
    case 3:
      unitChanged((QPageSetupWidget *)_o);
      return;
    case 4:
      topMarginChanged((QPageSetupWidget *)_o,*_a[1]);
      return;
    case 5:
      bottomMarginChanged((QPageSetupWidget *)_o,*_a[1]);
      return;
    case 6:
      leftMarginChanged((QPageSetupWidget *)_o,*_a[1]);
      return;
    case 7:
      rightMarginChanged((QPageSetupWidget *)_o,*_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QPageSetupWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPageSetupWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pageSizeChanged(); break;
        case 1: _t->pageOrientationChanged(); break;
        case 2: _t->pagesPerSheetChanged(); break;
        case 3: _t->unitChanged(); break;
        case 4: _t->topMarginChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 5: _t->bottomMarginChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 6: _t->leftMarginChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 7: _t->rightMarginChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        default: ;
        }
    }
}